

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O3

unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> __thiscall
duckdb::FileSystem::ExtractSubSystem(FileSystem *this,string *name)

{
  NotImplementedException *this_00;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"%s: Can\'t extract a sub system on a non-virtual file system","");
  (**(code **)((name->_M_dataplus)._M_p + 0x138))(&local_40,name);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_00,&local_60,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FileSystem> FileSystem::ExtractSubSystem(const string &name) {
	throw NotImplementedException("%s: Can't extract a sub system on a non-virtual file system", GetName());
}